

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall aggreports::LoadEnsembleMapping(aggreports *this)

{
  int iVar1;
  value_type vVar2;
  bool bVar3;
  FILE *__stream;
  reference pvVar4;
  mapped_type *this_00;
  reference piVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int *local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  const_iterator it;
  size_t i;
  allocator<int> local_3d;
  value_type_conflict local_3c;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> sidxtoensemble;
  Ensemble e;
  FILE *fin;
  aggreports *this_local;
  
  __stream = fopen("input/ensemble.bin","rb");
  if (__stream != (FILE *)0x0) {
    iVar1 = this->samplesize_;
    local_3c = 0;
    std::allocator<int>::allocator(&local_3d);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_38,(long)(iVar1 + 1),&local_3c,&local_3d);
    std::allocator<int>::~allocator(&local_3d);
    it._M_current =
         (int *)fread(&sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,8,1,__stream);
    while (vVar2 = sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_, it._M_current != (int *)0x0) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_38,
                          (long)(int)sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      *pvVar4 = vVar2;
      this_00 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->ensembletosidx_,
                             (key_type *)
                             ((long)&sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      std::vector<int,_std::allocator<int>_>::push_back
                (this_00,(value_type_conflict *)
                         &sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      it._M_current =
           (int *)fread(&sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,8,1,__stream);
    }
    local_70 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)local_38);
    local_68 = std::next<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          local_70,1);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_60,
               &local_68);
    while( true ) {
      local_78._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_38);
      bVar3 = __gnu_cxx::operator!=(&local_60,&local_78);
      if (!bVar3) break;
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_60);
      if (*piVar5 == 0) {
        fprintf(_stderr,"FATAL: All sidx must have associated ensemble IDs\n");
        exit(1);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_60);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  }
  return;
}

Assistant:

void aggreports::LoadEnsembleMapping() {

  FILE *fin = fopen(ENSEMBLE_FILE, "rb");
  if (fin == NULL) return;

  Ensemble e;
  std::vector<int> sidxtoensemble(samplesize_+1, 0);
  size_t i = fread(&e, sizeof(Ensemble), 1, fin);
  while (i != 0) {
    sidxtoensemble[e.sidx] = e.ensemble_id;
    ensembletosidx_[e.ensemble_id].push_back(e.sidx);
    i = fread(&e, sizeof(Ensemble), 1, fin);
  }

  // Check all sidx have ensemble IDs
  for (std::vector<int>::const_iterator it = std::next(sidxtoensemble.begin());
       it != sidxtoensemble.end(); ++it) {
    if (*it == 0) {
      fprintf(stderr, "FATAL: All sidx must have associated ensemble IDs\n");
      exit(EXIT_FAILURE);
    }
  }

}